

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_packing.cpp
# Opt level: O2

void __thiscall
packing::AssignedProtos::
addUniqueColors<packing::AssignedProtos::Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>*,std::vector<std::optional<packing::ProtoPalAttrs>,std::allocator<std::optional<packing::ProtoPalAttrs>>>>,std::remove_const_t>>
          (AssignedProtos *this,
          unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>
          *colors,Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
                  iter,
          Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
          *end,vector<ProtoPalette,_std::allocator<ProtoPalette>_> *protoPals)

{
  reference prVar1;
  const_iterator __first;
  const_iterator __last;
  pointer *this_00;
  Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
  local_40;
  
  local_40._iter._M_current = (optional<packing::ProtoPalAttrs> *)iter._array;
  local_40._array = (remove_const_t<decltype(_assigned)> *)colors;
  while (local_40._iter._M_current !=
         *(optional<packing::ProtoPalAttrs> **)
          &((iter._iter._M_current._M_current)->
           super__Optional_base<packing::ProtoPalAttrs,_false,_false>)._M_payload.
           super__Optional_payload<packing::ProtoPalAttrs,_true,_false,_false>.
           super__Optional_payload_base<packing::ProtoPalAttrs>._M_payload._M_value.bannedPages.
           super__Bvector_base<std::allocator<bool>_>._M_impl) {
    prVar1 = Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
             ::operator*(&local_40);
    this_00 = &(end->_array->
               super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
               )._M_impl.super__Vector_impl_data._M_start + prVar1->protoPalIndex;
    __first = ProtoPalette::begin((ProtoPalette *)this_00);
    __last = ProtoPalette::end((ProtoPalette *)this_00);
    std::__detail::
    _Insert_base<unsigned_short,unsigned_short,std::allocator<unsigned_short>,std::__detail::_Identity,std::equal_to<unsigned_short>,std::hash<unsigned_short>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::insert<unsigned_short_const*>
              ((_Insert_base<unsigned_short,unsigned_short,std::allocator<unsigned_short>,std::__detail::_Identity,std::equal_to<unsigned_short>,std::hash<unsigned_short>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)this,__first,__last);
    Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
    ::operator++(&local_40);
  }
  return;
}

Assistant:

static void addUniqueColors(std::unordered_set<uint16_t> &colors, Iter iter, Iter const &end,
	                            std::vector<ProtoPalette> const &protoPals) {
		for (; iter != end; ++iter) {
			ProtoPalette const &protoPal = protoPals[iter->protoPalIndex];
			colors.insert(protoPal.begin(), protoPal.end());
		}
	}